

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFHighLevelEncoder.cpp
# Opt level: O2

void ZXing::Pdf417::EncodeBinary
               (string *bytes,int startpos,int count,int startmode,
               vector<int,_std::allocator<int>_> *output)

{
  ulong uVar1;
  undefined4 in_register_0000000c;
  vector<int,_std::allocator<int>_> *this;
  long lVar2;
  int i_1;
  uint uVar3;
  value_type_conflict3 *__x;
  ulong uVar4;
  int chars [5];
  
  this = (vector<int,_std::allocator<int>_> *)CONCAT44(in_register_0000000c,startmode);
  if (startpos == 1 && count == 0) {
    std::vector<int,_std::allocator<int>_>::push_back(this,&SHIFT_TO_BYTE);
  }
  else {
    __x = &LATCH_TO_BYTE_PADDED;
    if (startpos % 6 == 0) {
      __x = &LATCH_TO_BYTE;
    }
    std::vector<int,_std::allocator<int>_>::push_back(this,__x);
    if (5 < startpos) {
      for (uVar4 = 0; 5 < (uint)(startpos - (int)uVar4); uVar4 = uVar4 + 6) {
        uVar1 = 0;
        for (lVar2 = -6; lVar2 != 0; lVar2 = lVar2 + 1) {
          uVar1 = uVar1 << 8 | (ulong)(byte)(bytes->_M_dataplus)._M_p[lVar2 + uVar4 + 6];
        }
        for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
          chars[lVar2] = (int)((long)uVar1 % 900);
          uVar1 = (long)uVar1 / 900;
        }
        for (uVar3 = 4; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
          std::vector<int,_std::allocator<int>_>::push_back(this,chars + uVar3);
        }
      }
      uVar4 = uVar4 & 0xffffffff;
      goto LAB_00189ac8;
    }
  }
  uVar4 = 0;
LAB_00189ac8:
  for (; (long)uVar4 < (long)startpos; uVar4 = uVar4 + 1) {
    chars[0] = (int)(byte)(bytes->_M_dataplus)._M_p[uVar4];
    std::vector<int,_std::allocator<int>_>::push_back(this,chars);
  }
  return;
}

Assistant:

static void EncodeBinary(const std::string& bytes, int startpos, int count, int startmode, std::vector<int>& output)
{
	if (count == 1 && startmode == TEXT_COMPACTION) {
		output.push_back(SHIFT_TO_BYTE);
	}
	else {
		if ((count % 6) == 0) {
			output.push_back(LATCH_TO_BYTE);
		}
		else {
			output.push_back(LATCH_TO_BYTE_PADDED);
		}
	}

	int idx = startpos;
	// Encode sixpacks
	if (count >= 6) {
		int chars[5];
		while ((startpos + count - idx) >= 6) {
			long t = 0;
			for (int i = 0; i < 6; i++) {
				t <<= 8;
				t += bytes[idx + i] & 0xff;
			}
			for (int i = 0; i < 5; i++) {
				chars[i] = t % 900;
				t /= 900;
			}
			for (int i = 4; i >= 0; i--) {
				output.push_back(chars[i]);
			}
			idx += 6;
		}
	}
	//Encode rest (remaining n<5 bytes if any)
	for (int i = idx; i < startpos + count; i++) {
		int ch = bytes[i] & 0xff;
		output.push_back(ch);
	}
}